

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  int iVar4;
  uint bits_per_pixel;
  bool local_51;
  int tga_colormap_type;
  int sz;
  int tga_colormap_bpp;
  int tga_bits_per_pixel;
  int tga_image_type;
  int tga_comp;
  int tga_h;
  int tga_w;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  stbi__get8(s);
  bVar1 = stbi__get8(s);
  if (1 < bVar1) {
    stbi__rewind(s);
    return 0;
  }
  sVar2 = stbi__get8(s);
  if (bVar1 == 1) {
    if ((sVar2 != '\x01') && (sVar2 != '\t')) {
      stbi__rewind(s);
      return 0;
    }
    stbi__skip(s,4);
    bVar1 = stbi__get8(s);
    tga_colormap_type = (int)bVar1;
    if (((tga_colormap_type != 8) && (tga_colormap_type != 0xf)) &&
       ((tga_colormap_type != 0x10 && ((tga_colormap_type != 0x18 && (tga_colormap_type != 0x20)))))
       ) {
      stbi__rewind(s);
      return 0;
    }
    stbi__skip(s,4);
  }
  else {
    if ((((sVar2 != '\x02') && (sVar2 != '\x03')) && (sVar2 != '\n')) && (sVar2 != '\v')) {
      stbi__rewind(s);
      return 0;
    }
    stbi__skip(s,9);
    tga_colormap_type = 0;
  }
  iVar3 = stbi__get16le(s);
  if (iVar3 < 1) {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  else {
    iVar4 = stbi__get16le(s);
    if (iVar4 < 1) {
      stbi__rewind(s);
      s_local._4_4_ = 0;
    }
    else {
      bVar1 = stbi__get8(s);
      bits_per_pixel = (uint)bVar1;
      stbi__get8(s);
      if (tga_colormap_type == 0) {
        local_51 = sVar2 == '\x03' || sVar2 == '\v';
        tga_bits_per_pixel = stbi__tga_get_comp(bits_per_pixel,(uint)local_51,(int *)0x0);
      }
      else {
        if ((bits_per_pixel != 8) && (bits_per_pixel != 0x10)) {
          stbi__rewind(s);
          return 0;
        }
        tga_bits_per_pixel = stbi__tga_get_comp(tga_colormap_type,0,(int *)0x0);
      }
      if (tga_bits_per_pixel == 0) {
        stbi__rewind(s);
        s_local._4_4_ = 0;
      }
      else {
        if (x != (int *)0x0) {
          *x = iVar3;
        }
        if (y != (int *)0x0) {
          *y = iVar4;
        }
        if (comp != (int *)0x0) {
          *comp = tga_bits_per_pixel;
        }
        s_local._4_4_ = 1;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp, tga_image_type, tga_bits_per_pixel, tga_colormap_bpp;
    int sz, tga_colormap_type;
    stbi__get8(s);                   // discard Offset
    tga_colormap_type = stbi__get8(s); // colormap type
    if( tga_colormap_type > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    tga_image_type = stbi__get8(s); // image type
    if ( tga_colormap_type == 1 ) { // colormapped (paletted) image
        if (tga_image_type != 1 && tga_image_type != 9) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip index of first colormap entry and number of entries
        sz = stbi__get8(s);    //   check bits per palette color entry
        if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip image x and y origin
        tga_colormap_bpp = sz;
    } else { // "normal" image w/o colormap - only RGB or grey allowed, +/- RLE
        if ( (tga_image_type != 2) && (tga_image_type != 3) && (tga_image_type != 10) && (tga_image_type != 11) ) {
            stbi__rewind(s);
            return 0; // only RGB or grey allowed, +/- RLE
        }
        stbi__skip(s,9); // skip colormap specification and image x/y origin
        tga_colormap_bpp = 0;
    }
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    tga_bits_per_pixel = stbi__get8(s); // bits per pixel
    stbi__get8(s); // ignore alpha bits
    if (tga_colormap_bpp != 0) {
        if((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16)) {
            // when using a colormap, tga_bits_per_pixel is the size of the indexes
            // I don't think anything but 8 or 16bit indexes makes sense
            stbi__rewind(s);
            return 0;
        }
        tga_comp = stbi__tga_get_comp(tga_colormap_bpp, 0, NULL);
    } else {
        tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3) || (tga_image_type == 11), NULL);
    }
    if(!tga_comp) {
      stbi__rewind(s);
      return 0;
    }
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp;
    return 1;                   // seems to have passed everything
}